

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::RootMark(Recycler *this,CollectionState markState)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  int iVar4;
  ConfigFlagsTable *pCVar5;
  undefined4 extraout_var;
  size_t sVar6;
  CollectionState CVar7;
  undefined8 *in_FS_OFFSET;
  RecyclerScanMemoryCallback local_30;
  RecyclerScanMemoryCallback scanMemory;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  BOOL stacksScannedByRuntime;
  size_t scannedRootBytes;
  CollectionState markState_local;
  Recycler *this_local;
  
  bVar2 = NeedOOMRescan(this);
  if ((bVar2) && (markState != CollectionStateRescanMark)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa82,"(!this->NeedOOMRescan() || markState == CollectionStateRescanMark)",
                       "!this->NeedOOMRescan() || markState == CollectionStateRescanMark");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pCVar5 = GetRecyclerFlagsTable(this);
  if ((pCVar5->Verbose & 1U) != 0) {
    pCVar5 = GetRecyclerFlagsTable(this);
    bVar2 = Js::Phases::IsEnabled(&pCVar5->Trace,RecyclerPhase);
    if (bVar2) {
      Output::Print(L"PreMark done, partial collect: %d\n",(ulong)(this->inPartialCollectMode & 1));
    }
  }
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  CVar7 = CollectionStateRescanFindRoots;
  if (markState == CollectionStateMark) {
    CVar7 = CollectionStateFindRoots;
  }
  if (CVar3 != CVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa89,
                       "(collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots))"
                       ,
                       "collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  scanMemory.recycler._4_4_ = 0;
  AutoFilterExceptionRegion::AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)&scanMemory,ExceptionType_All);
  RecyclerScanMemoryCallback::RecyclerScanMemoryCallback(&local_30,this);
  iVar4 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[3])
                    (this->collectionWrapper,&local_30,
                     (undefined1 *)((long)&scanMemory.recycler + 4));
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion((AutoFilterExceptionRegion *)&scanMemory);
  ___autoFilterExceptionRegion = FindRoots(this);
  ___autoFilterExceptionRegion = ___autoFilterExceptionRegion + CONCAT44(extraout_var,iVar4);
  if (scanMemory.recycler._4_4_ == 0) {
    sVar6 = ScanStack(this);
    ___autoFilterExceptionRegion = sVar6 + ___autoFilterExceptionRegion;
  }
  SetCollectionState(this,markState);
  if ((this->enableParallelMark & 1U) == 0) {
    ProcessMark(this,false);
  }
  else {
    DoParallelMark(this);
  }
  bVar2 = EndMark(this);
  if (bVar2) {
    ___autoFilterExceptionRegion = 0x500001;
  }
  return ___autoFilterExceptionRegion;
}

Assistant:

size_t
Recycler::RootMark(CollectionState markState)
{
    size_t scannedRootBytes = 0;
    Assert(!this->NeedOOMRescan() || markState == CollectionStateRescanMark);
#if ENABLE_PARTIAL_GC
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("PreMark done, partial collect: %d\n"), this->inPartialCollectMode);
#else
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("PreMark done, partial collect not available\n"));
#endif

    Assert(collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots));

    BOOL stacksScannedByRuntime = FALSE;
    {
        // We are about to scan roots in thread, notify the runtime first so it can stop threads if necessary and also provide additional roots
        AUTO_NO_EXCEPTION_REGION;
        RecyclerScanMemoryCallback scanMemory(this);
        scannedRootBytes += collectionWrapper->RootMarkCallback(scanMemory, &stacksScannedByRuntime);
    }

    scannedRootBytes += FindRoots();

    if (!stacksScannedByRuntime)
    {
        // The runtime did not scan the stack(s) for us, so we use the normal Recycler code.
        scannedRootBytes += ScanStack();
    }

    this->SetCollectionState(markState);

#if ENABLE_CONCURRENT_GC
    if (this->enableParallelMark)
    {
        this->DoParallelMark();
    }
    else
#endif
    {
        this->ProcessMark(false);
    }

    if (this->EndMark())
    {
        // REVIEW: This heuristic doesn't apply when partial is off so there's no need
        // to modify scannedRootBytes here, correct?
#if ENABLE_PARTIAL_GC
        // return large root scanned byte to not get into partial mode if we are low on memory
        scannedRootBytes = RecyclerSweepManager::MaxPartialCollectRescanRootBytes + 1;
#endif
    }

    return scannedRootBytes;
}